

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QImage>::resize_internal(QList<QImage> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QImage> *this_00;
  __off_t __length;
  QArrayDataPointer<QImage> *in_RSI;
  QArrayDataPointer<QImage> *in_RDI;
  QArrayDataPointer<QImage> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QImage> *this_01;
  QArrayDataPointer<QImage> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QImage> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QImage> *__file;
  
  QArrayDataPointer<QImage>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QImage>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 = (QArrayDataPointer<QImage> *)capacity((QList<QImage> *)0x8c4cd1);
    qVar2 = QArrayDataPointer<QImage>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QImage> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QImage> *)QArrayDataPointer<QImage>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QImage>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QImage>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (QImage **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}